

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

PixelBufferAccess * __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredImage::getAccessInternal
          (PixelBufferAccess *__return_storage_ptr__,LayeredImage *this)

{
  TextureFormat *pTVar1;
  int i;
  long lVar2;
  
  switch(this->m_type) {
  case TEXTURETYPE_2D:
    pTVar1 = (TextureFormat *)
             (((this->m_tex2D).m_ptr)->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar1;
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar2] =
           (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar2] =
           (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  default:
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
              (&__return_storage_ptr__->super_ConstPixelBufferAccess);
    return __return_storage_ptr__;
  case TEXTURETYPE_2D_ARRAY:
    pTVar1 = (TextureFormat *)
             (((this->m_tex2DArray).m_ptr)->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar1;
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar2] =
           (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar2] =
           (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  case TEXTURETYPE_3D:
    pTVar1 = (TextureFormat *)
             (((this->m_tex3D).m_ptr)->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar1;
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar2] =
           (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar2] =
           (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    break;
  case TEXTURETYPE_BUFFER:
    pTVar1 = (TextureFormat *)
             (((this->m_texBuffer).m_ptr)->super_TextureLevelPyramid).m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super_ConstPixelBufferAccess).m_format = *pTVar1;
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_size.m_data[lVar2] =
           (&pTVar1[1].order)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_ConstPixelBufferAccess).m_pitch.m_data[lVar2] =
           (&pTVar1[2].type)[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  (__return_storage_ptr__->super_ConstPixelBufferAccess).m_data = (void *)pTVar1[4];
  return __return_storage_ptr__;
}

Assistant:

PixelBufferAccess LayeredImage::getAccessInternal (void) const
{
	DE_ASSERT(m_type == TEXTURETYPE_BUFFER || m_type == TEXTURETYPE_2D || m_type == TEXTURETYPE_3D || m_type == TEXTURETYPE_2D_ARRAY);

	return m_type == TEXTURETYPE_BUFFER		? m_texBuffer->getLevel(0)
		 : m_type == TEXTURETYPE_2D			? m_tex2D->getLevel(0)
		 : m_type == TEXTURETYPE_3D			? m_tex3D->getLevel(0)
		 : m_type == TEXTURETYPE_2D_ARRAY	? m_tex2DArray->getLevel(0)
		 : PixelBufferAccess();
}